

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void memory_region_update_container_subregions(MemoryRegion_conflict *subregion)

{
  MemoryRegion_conflict *mr_00;
  MemoryRegion *local_20;
  MemoryRegion_conflict *other;
  MemoryRegion_conflict *mr;
  MemoryRegion_conflict *subregion_local;
  
  mr_00 = subregion->container;
  memory_region_transaction_begin_tricore();
  local_20 = (mr_00->subregions).tqh_first;
  do {
    if (local_20 == (MemoryRegion *)0x0) {
      (subregion->subregions_link).tqe_next = (MemoryRegion *)0x0;
      (subregion->subregions_link).tqe_circ.tql_prev = (mr_00->subregions).tqh_circ.tql_prev;
      ((mr_00->subregions).tqh_circ.tql_prev)->tql_next = subregion;
      (mr_00->subregions).tqh_circ.tql_prev = (QTailQLink *)&subregion->subregions_link;
LAB_012b356e:
      mr_00->uc->memory_region_update_pending = true;
      memory_region_transaction_commit_tricore(mr_00);
      return;
    }
    if (local_20->priority <= subregion->priority) {
      (subregion->subregions_link).tqe_circ.tql_prev = (local_20->subregions_link).tqe_circ.tql_prev
      ;
      (subregion->subregions_link).tqe_next = local_20;
      ((local_20->subregions_link).tqe_circ.tql_prev)->tql_next = subregion;
      (local_20->subregions_link).tqe_circ.tql_prev = (QTailQLink *)&subregion->subregions_link;
      goto LAB_012b356e;
    }
    local_20 = (local_20->subregions_link).tqe_next;
  } while( true );
}

Assistant:

static void memory_region_update_container_subregions(MemoryRegion *subregion)
{
    MemoryRegion *mr = subregion->container;
    MemoryRegion *other;

    memory_region_transaction_begin();

    QTAILQ_FOREACH(other, &mr->subregions, subregions_link) {
        if (subregion->priority >= other->priority) {
            QTAILQ_INSERT_BEFORE(other, subregion, subregions_link);
            goto done;
        }
    }
    QTAILQ_INSERT_TAIL(&mr->subregions, subregion, subregions_link);

done:
    mr->uc->memory_region_update_pending = true;
    memory_region_transaction_commit(mr);
}